

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O2

double __thiscall leveldb::Histogram::Percentile(Histogram *this,double p)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar3 = (p / 100.0) * this->num_;
  dVar4 = 0.0;
  lVar2 = 0x28;
  lVar1 = 0;
  do {
    if (lVar1 == -0x9a) {
      dVar3 = this->max_;
LAB_00104a9e:
      if ((ulong)-lVar1 < 0x9a) {
        dVar3 = dVar4;
      }
      return dVar3;
    }
    dVar6 = *(double *)((long)this->buckets_ + lVar2 + -0x28);
    dVar4 = dVar4 + dVar6;
    if (dVar3 <= dVar4) {
      if (lVar1 == 0) {
        dVar5 = 0.0;
      }
      else {
        dVar5 = (double)(&kBucketLimit)[~(uint)lVar1];
      }
      dVar6 = dVar4 - dVar6;
      dVar5 = (*(double *)(&DAT_0010a028 + lVar2) - dVar5) * ((dVar3 - dVar6) / (dVar4 - dVar6)) +
              dVar5;
      dVar6 = this->min_;
      if (this->min_ <= dVar5) {
        dVar6 = dVar5;
      }
      dVar3 = this->max_;
      dVar4 = dVar3;
      if (dVar6 <= dVar3) {
        dVar4 = dVar6;
      }
      goto LAB_00104a9e;
    }
    lVar1 = lVar1 + -1;
    lVar2 = lVar2 + 8;
  } while( true );
}

Assistant:

double Histogram::Percentile(double p) const {
  double threshold = num_ * (p / 100.0);
  double sum = 0;
  for (int b = 0; b < kNumBuckets; b++) {
    sum += buckets_[b];
    if (sum >= threshold) {
      // Scale linearly within this bucket
      double left_point = (b == 0) ? 0 : kBucketLimit[b - 1];
      double right_point = kBucketLimit[b];
      double left_sum = sum - buckets_[b];
      double right_sum = sum;
      double pos = (threshold - left_sum) / (right_sum - left_sum);
      double r = left_point + (right_point - left_point) * pos;
      if (r < min_) r = min_;
      if (r > max_) r = max_;
      return r;
    }
  }
  return max_;
}